

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_13e445::BuildFileImpl::parseCommandsMapping(BuildFileImpl *this,MappingNode *map)

{
  pointer *pppBVar1;
  KeyValueNode *pKVar2;
  iterator __position;
  StringRef name_00;
  StringRef name_01;
  StringRef name_02;
  StringRef Key;
  StringRef Key_00;
  _Alloc_hider _Var3;
  char cVar4;
  int iVar5;
  Node *pNVar6;
  MappingNode *C;
  Node *pNVar7;
  BuildFileImpl *pBVar8;
  Tool *pTVar9;
  SequenceNode *C_00;
  Command *pCVar10;
  long *plVar11;
  uint uVar12;
  char *pcVar13;
  ScalarNode *scalar;
  ScalarNode *scalar_00;
  ScalarNode *extraout_RDX;
  ScalarNode *extraout_RDX_00;
  ScalarNode *extraout_RDX_01;
  ScalarNode *extraout_RDX_02;
  ScalarNode *scalar_02;
  ScalarNode *scalar_03;
  ScalarNode *extraout_RDX_03;
  ScalarNode *pSVar15;
  ScalarNode *extraout_RDX_04;
  SequenceNode *__range5;
  bool bVar16;
  pair<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_bool>
  pVar17;
  StringRef message;
  StringRef message_00;
  StringRef name_03;
  StringRef name_04;
  StringRef message_01;
  StringRef name_05;
  StringRef message_02;
  StringRef message_03;
  StringRef name_06;
  StringRef message_04;
  StringRef message_05;
  StringRef message_06;
  StringRef message_07;
  StringRef message_08;
  StringRef message_09;
  StringRef message_10;
  StringRef message_11;
  StringRef message_12;
  iterator it;
  Node *node;
  iterator __begin5;
  vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> nodes;
  string value;
  string name;
  iterator __begin8;
  iterator __begin2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  values;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_148;
  Command *local_140;
  undefined1 local_138 [32];
  _Alloc_hider local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  undefined1 local_f8 [32];
  string local_d8;
  undefined1 local_b8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  StringMapImpl *local_70;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_68;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_60;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  Command *local_38;
  char *pcVar14;
  ScalarNode *scalar_01;
  
  local_60.Base = (MappingNode *)llvm::yaml::begin<llvm::yaml::MappingNode>(map);
  if (local_60.Base == (MappingNode *)0x0) {
    bVar16 = true;
  }
  else {
    pcVar13 = (char *)&this->commands;
    local_70 = (StringMapImpl *)pcVar13;
    do {
      pKVar2 = (local_60.Base)->CurrentEntry;
      if (pKVar2 == (KeyValueNode *)0x0) {
LAB_00139837:
        pcVar13 = 
        "ValueT &llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode, llvm::yaml::KeyValueNode>::operator*() const [BaseT = llvm::yaml::MappingNode, ValueT = llvm::yaml::KeyValueNode]"
        ;
LAB_00139863:
        __assert_fail("Base && Base->CurrentEntry && \"Attempted to dereference end iterator!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/YAMLParser.h"
                      ,0x151,pcVar13);
      }
      pNVar6 = llvm::yaml::KeyValueNode::getKey(pKVar2);
      if (pNVar6->TypeID == 1) {
        pNVar6 = llvm::yaml::KeyValueNode::getValue(pKVar2);
        if (pNVar6->TypeID != 4) {
          pNVar7 = llvm::yaml::KeyValueNode::getValue(pKVar2);
          pNVar6 = (Node *)(pNVar7->SourceRange).Start.Ptr;
          pcVar14 = (pNVar7->SourceRange).End.Ptr;
          pcVar13 = "invalid value type in \'commands\' map";
          goto LAB_00138aaf;
        }
        pNVar6 = llvm::yaml::KeyValueNode::getKey(pKVar2);
        (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                  ((string *)&local_90,pNVar6,scalar);
        C = (MappingNode *)llvm::yaml::KeyValueNode::getValue(pKVar2);
        Key.Length = local_90._8_8_;
        Key.Data = (char *)local_90._M_allocated_capacity;
        iVar5 = llvm::StringMapImpl::FindKey(local_70,Key);
        if ((iVar5 == -1) ||
           (pcVar13 = (char *)(ulong)(this->commands).super_StringMapImpl.NumBuckets,
           (Command *)(long)iVar5 == (Command *)pcVar13)) {
          local_148.Base = (MappingNode *)llvm::yaml::begin<llvm::yaml::MappingNode>(C);
          local_138._0_8_ = (Command *)0x0;
          bVar16 = llvm::yaml::
                   basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                   operator==(&local_148,
                              (basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                               *)local_138);
          if (bVar16) {
            pNVar7 = llvm::yaml::KeyValueNode::getKey(pKVar2);
            pNVar6 = (Node *)(pNVar7->SourceRange).Start.Ptr;
            pcVar14 = (pNVar7->SourceRange).End.Ptr;
            pcVar13 = "missing \'tool\' key for command in \'command\' map";
            goto LAB_00138b18;
          }
          if ((local_148.Base == (MappingNode *)0x0) ||
             ((local_148.Base)->CurrentEntry == (KeyValueNode *)0x0)) goto LAB_0013986d;
          pBVar8 = (BuildFileImpl *)llvm::yaml::KeyValueNode::getKey((local_148.Base)->CurrentEntry)
          ;
          name_03.Length = (size_t)pcVar13;
          name_03.Data = (char *)0x4;
          bVar16 = nodeIsScalarString(pBVar8,(Node *)0x1be9d6,name_03);
          if (bVar16) {
            if ((local_148.Base == (MappingNode *)0x0) ||
               ((local_148.Base)->CurrentEntry == (KeyValueNode *)0x0)) goto LAB_0013986d;
            pNVar6 = llvm::yaml::KeyValueNode::getValue((local_148.Base)->CurrentEntry);
            if (pNVar6->TypeID == 1) {
              if ((local_148.Base == (MappingNode *)0x0) ||
                 ((local_148.Base)->CurrentEntry == (KeyValueNode *)0x0)) {
LAB_0013986d:
                __assert_fail("Base && Base->CurrentEntry && \"Attempted to access end iterator!\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/YAMLParser.h"
                              ,0x14b,
                              "ValueT *llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode, llvm::yaml::KeyValueNode>::operator->() const [BaseT = llvm::yaml::MappingNode, ValueT = llvm::yaml::KeyValueNode]"
                             );
              }
              pNVar6 = llvm::yaml::KeyValueNode::getValue((local_148.Base)->CurrentEntry);
              (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                        ((string *)local_138,pNVar6,scalar_00);
              if ((local_148.Base == (MappingNode *)0x0) ||
                 ((local_148.Base)->CurrentEntry == (KeyValueNode *)0x0)) goto LAB_0013986d;
              name_00.Length = local_138._8_8_;
              name_00.Data = (char *)local_138._0_8_;
              pcVar13 = (char *)llvm::yaml::KeyValueNode::getValue((local_148.Base)->CurrentEntry);
              pTVar9 = getOrCreateTool(this,name_00,(Node *)pcVar13);
              if ((Command *)local_138._0_8_ != (Command *)(local_138 + 0x10)) {
                operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
              }
              if (pTVar9 == (Tool *)0x0) {
                iVar5 = 1;
              }
              else {
                pcVar13 = (char *)local_90._8_8_;
                (*pTVar9->_vptr_Tool[5])(&local_140,pTVar9,local_90._M_allocated_capacity);
                if (local_140 == (Command *)0x0) {
                  if ((local_148.Base == (MappingNode *)0x0) ||
                     ((local_148.Base)->CurrentEntry == (KeyValueNode *)0x0)) goto LAB_0013986d;
                  pNVar6 = llvm::yaml::KeyValueNode::getValue((local_148.Base)->CurrentEntry);
                  message_12.Length = (size_t)"tool failed to create a command";
                  message_12.Data = (pNVar6->SourceRange).End.Ptr;
                  pcVar13 = "tool failed to create a command";
                  error(this,(Node *)(pNVar6->SourceRange).Start.Ptr,message_12);
                  iVar5 = 1;
                }
                else {
LAB_00138c71:
                  while( true ) {
                    llvm::yaml::
                    basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                    operator++(&local_148);
                    if (local_148.Base == (MappingNode *)0x0) {
                      (*this->delegate->_vptr_BuildFileDelegate[0xb])
                                (this->delegate,local_90._M_allocated_capacity,local_90._8_8_,
                                 local_140);
                      Key_00.Length = local_90._8_8_;
                      Key_00.Data = (char *)local_90._M_allocated_capacity;
                      pVar17 = llvm::
                               StringMap<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_llvm::MallocAllocator>
                               ::try_emplace<>((StringMap<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_llvm::MallocAllocator>
                                                *)local_70,Key_00);
                      pcVar13 = (char *)local_140;
                      local_140 = (Command *)0x0;
                      plVar11 = *(long **)(*(long *)pVar17.first.
                                                                                                        
                                                  super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
                                                  .Ptr.
                                                  super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
                                          + 8);
                      *(char **)(*(long *)pVar17.first.
                                          super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
                                          .Ptr.
                                          super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
                                + 8) = pcVar13;
                      if (plVar11 == (long *)0x0) {
                        iVar5 = 0;
                        goto LAB_00138b22;
                      }
                      (**(code **)(*plVar11 + 8))();
                      iVar5 = 0;
                      goto LAB_001397f6;
                    }
                    if ((((local_148.Base)->CurrentEntry == (KeyValueNode *)0x0) ||
                        (pBVar8 = (BuildFileImpl *)
                                  llvm::yaml::KeyValueNode::getKey((local_148.Base)->CurrentEntry),
                        local_148.Base == (MappingNode *)0x0)) ||
                       ((local_148.Base)->CurrentEntry == (KeyValueNode *)0x0)) goto LAB_0013986d;
                    C_00 = (SequenceNode *)
                           llvm::yaml::KeyValueNode::getValue((local_148.Base)->CurrentEntry);
                    name_04.Length = (size_t)pcVar13;
                    name_04.Data = (char *)0x6;
                    bVar16 = nodeIsScalarString(pBVar8,(Node *)0x1c6356,name_04);
                    if (!bVar16) break;
                    if ((C_00->super_Node).TypeID == 5) {
                      local_d8._M_dataplus._M_p = (pointer)0x0;
                      local_d8._M_string_length = 0;
                      local_d8.field_2._M_allocated_capacity = 0;
                      local_f8._0_8_ = llvm::yaml::begin<llvm::yaml::SequenceNode>(C_00);
                      pSVar15 = extraout_RDX;
                      while ((SequenceNode *)local_f8._0_8_ != (SequenceNode *)0x0) {
                        pNVar6 = *(Node **)(local_f8._0_8_ + 0x50);
                        if (pNVar6 == (Node *)0x0) goto LAB_0013984e;
                        if (pNVar6->TypeID == 1) {
                          (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                    ((string *)local_138,pNVar6,pSVar15);
                          name_01.Length = local_138._8_8_;
                          name_01.Data = (char *)local_138._0_8_;
                          local_b8._0_8_ = getOrCreateNode(this,name_01,true);
                          if (local_d8._M_string_length == local_d8.field_2._M_allocated_capacity) {
                            std::
                            vector<llbuild::buildsystem::Node*,std::allocator<llbuild::buildsystem::Node*>>
                            ::_M_realloc_insert<llbuild::buildsystem::Node*>
                                      ((vector<llbuild::buildsystem::Node*,std::allocator<llbuild::buildsystem::Node*>>
                                        *)&local_d8,(iterator)local_d8._M_string_length,
                                       (Node **)local_b8);
                          }
                          else {
                            *(undefined8 *)local_d8._M_string_length = local_b8._0_8_;
                            local_d8._M_string_length = local_d8._M_string_length + 8;
                          }
                          if ((Command *)local_138._0_8_ != (Command *)(local_138 + 0x10)) {
                            operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
                          }
                        }
                        else {
                          message_01.Length = (size_t)"invalid node type in \'inputs\' command key";
                          message_01.Data = (pNVar6->SourceRange).End.Ptr;
                          error(this,(Node *)(pNVar6->SourceRange).Start.Ptr,message_01);
                        }
                        llvm::yaml::
                        basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::
                        operator++((basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                    *)local_f8);
                        pSVar15 = extraout_RDX_00;
                      }
                      local_138._24_8_ = (pBVar8->mainFilename).field_2._M_allocated_capacity;
                      uVar12 = *(int *)((long)&(pBVar8->mainFilename).field_2 + 8) -
                               (int)local_138._24_8_;
                      pcVar13 = (char *)(ulong)uVar12;
                      local_138._0_8_ = this->delegate;
                      local_138._8_8_ = (this->mainFilename)._M_dataplus._M_p;
                      local_138._16_8_ = (this->mainFilename)._M_string_length;
                      local_118._M_p._0_4_ = uVar12;
                      (*(local_140->super_JobDescriptor)._vptr_JobDescriptor[8])
                                (local_140,local_138,&local_d8);
LAB_001392f2:
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_d8._M_dataplus._M_p !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0) {
                        operator_delete(local_d8._M_dataplus._M_p,
                                        local_d8.field_2._M_allocated_capacity -
                                        (long)local_d8._M_dataplus._M_p);
                      }
                    }
                    else {
                      message_03.Length = (size_t)"invalid value type for \'inputs\' command key";
                      message_03.Data = (C_00->super_Node).SourceRange.End.Ptr;
                      pcVar13 = "invalid value type for \'inputs\' command key";
                      error(this,(Node *)(C_00->super_Node).SourceRange.Start.Ptr,message_03);
                    }
                  }
                  name_05.Length = (size_t)pcVar13;
                  name_05.Data = (char *)0x7;
                  bVar16 = nodeIsScalarString(pBVar8,(Node *)0x1c636c,name_05);
                  if (bVar16) {
                    if ((C_00->super_Node).TypeID == 5) {
                      local_d8._M_dataplus._M_p = (pointer)0x0;
                      local_d8._M_string_length = 0;
                      local_d8.field_2._M_allocated_capacity = 0;
                      local_f8._0_8_ = llvm::yaml::begin<llvm::yaml::SequenceNode>(C_00);
                      pSVar15 = extraout_RDX_01;
                      while ((SequenceNode *)local_f8._0_8_ != (SequenceNode *)0x0) {
                        pNVar6 = *(Node **)(local_f8._0_8_ + 0x50);
                        if (pNVar6 == (Node *)0x0) goto LAB_0013984e;
                        if (pNVar6->TypeID == 1) {
                          (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                    ((string *)local_138,pNVar6,pSVar15);
                          name_02.Length = local_138._8_8_;
                          name_02.Data = (char *)local_138._0_8_;
                          pCVar10 = (Command *)getOrCreateNode(this,name_02,true);
                          if ((Command *)local_138._0_8_ != (Command *)(local_138 + 0x10)) {
                            operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
                          }
                          local_138._0_8_ = pCVar10;
                          if (local_d8._M_string_length == local_d8.field_2._M_allocated_capacity) {
                            std::
                            vector<llbuild::buildsystem::Node*,std::allocator<llbuild::buildsystem::Node*>>
                            ::_M_realloc_insert<llbuild::buildsystem::Node*const&>
                                      ((vector<llbuild::buildsystem::Node*,std::allocator<llbuild::buildsystem::Node*>>
                                        *)&local_d8,(iterator)local_d8._M_string_length,
                                       (Node **)local_138);
                          }
                          else {
                            *(Command **)local_d8._M_string_length = pCVar10;
                            local_d8._M_string_length = local_d8._M_string_length + 8;
                          }
                          local_b8._0_8_ = local_140;
                          __position._M_current =
                               (Command **)
                               (((vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                                  *)&((Node *)local_138._0_8_)->Anchor)->
                               super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
                          if (__position._M_current ==
                              (Command **)(((Node *)local_138._0_8_)->Tag).Data) {
                            std::
                            vector<llbuild::buildsystem::Command*,std::allocator<llbuild::buildsystem::Command*>>
                            ::_M_realloc_insert<llbuild::buildsystem::Command*>
                                      ((vector<llbuild::buildsystem::Command*,std::allocator<llbuild::buildsystem::Command*>>
                                        *)&((Node *)local_138._0_8_)->Anchor,__position,
                                       (Command **)local_b8);
                          }
                          else {
                            *__position._M_current = local_140;
                            pppBVar1 = &(((vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                                           *)&((Node *)local_138._0_8_)->Anchor)->
                                        super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                                        )._M_impl.super__Vector_impl_data._M_finish;
                            *pppBVar1 = *pppBVar1 + 1;
                          }
                        }
                        else {
                          message_02.Length = (size_t)"invalid node type in \'outputs\' command key"
                          ;
                          message_02.Data = (pNVar6->SourceRange).End.Ptr;
                          error(this,(Node *)(pNVar6->SourceRange).Start.Ptr,message_02);
                        }
                        llvm::yaml::
                        basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::
                        operator++((basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                    *)local_f8);
                        pSVar15 = extraout_RDX_02;
                      }
                      local_138._24_8_ = (pBVar8->mainFilename).field_2._M_allocated_capacity;
                      uVar12 = *(int *)((long)&(pBVar8->mainFilename).field_2 + 8) -
                               (int)local_138._24_8_;
                      pcVar13 = (char *)(ulong)uVar12;
                      local_138._0_8_ = this->delegate;
                      local_138._8_8_ = (this->mainFilename)._M_dataplus._M_p;
                      local_138._16_8_ = (this->mainFilename)._M_string_length;
                      local_118._M_p._0_4_ = uVar12;
                      (*(local_140->super_JobDescriptor)._vptr_JobDescriptor[9])
                                (local_140,local_138,&local_d8);
                      goto LAB_001392f2;
                    }
                    message_04.Length = (size_t)"invalid value type for \'outputs\' command key";
                    message_04.Data = (C_00->super_Node).SourceRange.End.Ptr;
                    pcVar13 = "invalid value type for \'outputs\' command key";
                    error(this,(Node *)(C_00->super_Node).SourceRange.Start.Ptr,message_04);
                    goto LAB_00138c71;
                  }
                  name_06.Length = (size_t)pcVar13;
                  name_06.Data = (char *)0xb;
                  bVar16 = nodeIsScalarString(pBVar8,(Node *)0x1c4d81,name_06);
                  pCVar10 = local_140;
                  if (bVar16) {
                    if ((C_00->super_Node).TypeID == 1) {
                      local_138._24_8_ = (pBVar8->mainFilename).field_2._M_allocated_capacity;
                      local_138._0_8_ = this->delegate;
                      local_138._8_8_ = (this->mainFilename)._M_dataplus._M_p;
                      local_138._16_8_ = (this->mainFilename)._M_string_length;
                      local_118._M_p._0_4_ =
                           *(int *)((long)&(pBVar8->mainFilename).field_2 + 8) -
                           (int)local_138._24_8_;
                      (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                (&local_d8,C_00,(ScalarNode *)local_138._16_8_);
                      pcVar13 = (char *)local_d8._M_string_length;
                      (*(pCVar10->super_JobDescriptor)._vptr_JobDescriptor[7])
                                (pCVar10,local_138,local_d8._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                        operator_delete(local_d8._M_dataplus._M_p,
                                        local_d8.field_2._M_allocated_capacity + 1);
                      }
                    }
                    else {
                      message_06.Length =
                           (size_t)"invalid value type for \'description\' command key";
                      message_06.Data = (C_00->super_Node).SourceRange.End.Ptr;
                      pcVar13 = "invalid value type for \'description\' command key";
                      error(this,(Node *)(C_00->super_Node).SourceRange.Start.Ptr,message_06);
                    }
                    goto LAB_00138c71;
                  }
                  if (*(int *)&pBVar8->delegate != 1) {
                    message_07.Length = (size_t)"invalid key type in \'commands\' map";
                    message_07.Data = *(char **)((long)&(pBVar8->mainFilename).field_2 + 8);
                    pcVar13 = "invalid key type in \'commands\' map";
                    error(this,(Node *)(pBVar8->mainFilename).field_2._M_allocated_capacity,
                          message_07);
                    goto LAB_00138c71;
                  }
                  (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                            (&local_d8,pBVar8,scalar_01);
                  _Var3._M_p = local_d8._M_dataplus._M_p;
                  pCVar10 = local_140;
                  uVar12 = (C_00->super_Node).TypeID;
                  if (uVar12 == 1) {
                    local_138._24_8_ = (pBVar8->mainFilename).field_2._M_allocated_capacity;
                    local_138._0_8_ = this->delegate;
                    local_138._8_8_ = (this->mainFilename)._M_dataplus._M_p;
                    local_138._16_8_ = (this->mainFilename)._M_string_length;
                    local_118._M_p._0_4_ =
                         *(int *)((long)&(pBVar8->mainFilename).field_2 + 8) - (int)local_138._24_8_
                    ;
                    local_38 = (Command *)local_d8._M_string_length;
                    (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                              ((string *)local_f8,C_00,(ScalarNode *)local_138._16_8_);
                    pcVar13 = (char *)local_38;
                    iVar5 = (*(pCVar10->super_JobDescriptor)._vptr_JobDescriptor[10])
                                      (pCVar10,local_138,_Var3._M_p,local_38,local_f8._0_8_,
                                       local_f8._8_8_);
                    cVar4 = (char)iVar5;
                    if ((SequenceNode *)local_f8._0_8_ != (SequenceNode *)(local_f8 + 0x10)) {
                      operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
                    }
LAB_00139642:
                    if (cVar4 == '\0') {
                      iVar5 = 1;
                      goto LAB_0013965b;
                    }
                    iVar5 = 0;
                    bVar16 = true;
                  }
                  else {
                    if (uVar12 == 5) {
                      local_f8._0_8_ = (SequenceNode *)0x0;
                      local_f8._8_8_ = (pointer)0x0;
                      local_f8._16_8_ = 0;
                      local_b8._0_8_ = llvm::yaml::begin<llvm::yaml::SequenceNode>(C_00);
                      pSVar15 = extraout_RDX_03;
                      while (pcVar13 = (char *)local_d8._M_string_length,
                            _Var3._M_p = local_d8._M_dataplus._M_p, pCVar10 = local_140,
                            (Command *)local_b8._0_8_ != (Command *)0x0) {
                        pNVar6 = *(Node **)(local_b8._0_8_ + 0x50);
                        if (pNVar6 == (Node *)0x0) goto LAB_0013984e;
                        if (pNVar6->TypeID == 1) {
                          (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                    ((string *)local_138,pNVar6,pSVar15);
                          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                          emplace_back<std::__cxx11::string>
                                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                      *)local_f8,(string *)local_138);
                          if ((Command *)local_138._0_8_ != (Command *)(local_138 + 0x10)) {
                            operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
                          }
                        }
                        else {
                          message_08.Length =
                               (size_t)"invalid value type for command in \'commands\' map";
                          message_08.Data = (pNVar6->SourceRange).End.Ptr;
                          error(this,(Node *)(pNVar6->SourceRange).Start.Ptr,message_08);
                        }
                        llvm::yaml::
                        basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::
                        operator++((basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                    *)local_b8);
                        pSVar15 = extraout_RDX_04;
                      }
                      local_138._24_8_ = (pBVar8->mainFilename).field_2._M_allocated_capacity;
                      local_138._0_8_ = this->delegate;
                      local_138._8_8_ = (this->mainFilename)._M_dataplus._M_p;
                      local_138._16_8_ = (this->mainFilename)._M_string_length;
                      local_118._M_p._0_4_ =
                           *(int *)((long)&(pBVar8->mainFilename).field_2 + 8) -
                           (int)local_138._24_8_;
                      local_b8._0_8_ = (Command *)0x0;
                      local_b8._8_8_ = 0;
                      local_b8._16_8_ = (ScalarNode *)0x0;
                      std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>::
                      _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                ((vector<llvm::StringRef,std::allocator<llvm::StringRef>> *)local_b8
                                 ,local_f8._0_8_,local_f8._8_8_);
                      iVar5 = (*(pCVar10->super_JobDescriptor)._vptr_JobDescriptor[0xb])
                                        (pCVar10,local_138,_Var3._M_p,pcVar13,local_b8._0_8_,
                                         (long)(local_b8._8_8_ - local_b8._0_8_) >> 4);
                      cVar4 = (char)iVar5;
                      if ((Command *)local_b8._0_8_ != (Command *)0x0) {
                        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
                      }
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_f8);
                      goto LAB_00139642;
                    }
                    if (uVar12 == 4) {
                      local_58.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      local_58.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      local_58.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      local_68.Base =
                           (MappingNode *)
                           llvm::yaml::begin<llvm::yaml::MappingNode>((MappingNode *)C_00);
                      while (pcVar13 = (char *)local_d8._M_string_length,
                            _Var3._M_p = local_d8._M_dataplus._M_p, pCVar10 = local_140,
                            local_68.Base != (MappingNode *)0x0) {
                        pKVar2 = (local_68.Base)->CurrentEntry;
                        if (pKVar2 == (KeyValueNode *)0x0) goto LAB_00139837;
                        pNVar6 = llvm::yaml::KeyValueNode::getKey(pKVar2);
                        if (pNVar6->TypeID == 1) {
                          pNVar6 = llvm::yaml::KeyValueNode::getValue(pKVar2);
                          if (pNVar6->TypeID != 1) {
                            pNVar6 = llvm::yaml::KeyValueNode::getKey(pKVar2);
                            pcVar13 = "invalid value type for \'";
                            goto LAB_001391eb;
                          }
                          pNVar6 = llvm::yaml::KeyValueNode::getKey(pKVar2);
                          (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                    ((string *)local_f8,pNVar6,scalar_02);
                          pNVar6 = llvm::yaml::KeyValueNode::getValue(pKVar2);
                          (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                    ((string *)local_b8,pNVar6,scalar_03);
                          local_138._0_8_ = local_138 + 0x10;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)local_138,local_f8._0_8_,
                                     (long)&((_Alloc_hider *)local_f8._8_8_)->_M_p + local_f8._0_8_)
                          ;
                          local_118._M_p = (pointer)&local_108;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_118,local_b8._0_8_,
                                     (long)&((Node *)local_b8._0_8_)->_vptr_Node + local_b8._8_8_);
                          std::
                          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                          ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                                      *)&local_58,
                                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_138);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_118._M_p != &local_108) {
                            operator_delete(local_118._M_p,local_108._0_8_ + 1);
                          }
                          if ((Command *)local_138._0_8_ != (Command *)(local_138 + 0x10)) {
                            operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
                          }
                          pSVar15 = (ScalarNode *)local_b8._16_8_;
                          pCVar10 = (Command *)local_b8._0_8_;
                          if ((Command *)local_b8._0_8_ != (Command *)(local_b8 + 0x10))
                          goto LAB_00139272;
                        }
                        else {
                          pNVar6 = llvm::yaml::KeyValueNode::getKey(pKVar2);
                          pcVar13 = "invalid key type for \'";
LAB_001391eb:
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_f8,pcVar13,&local_d8);
                          plVar11 = (long *)std::__cxx11::string::append(local_f8);
                          pCVar10 = (Command *)(plVar11 + 2);
                          if ((Command *)*plVar11 == pCVar10) {
                            local_138._16_8_ = (pCVar10->super_JobDescriptor)._vptr_JobDescriptor;
                            local_138._24_8_ = plVar11[3];
                            local_138._0_8_ = (Command *)(local_138 + 0x10);
                          }
                          else {
                            local_138._16_8_ = (pCVar10->super_JobDescriptor)._vptr_JobDescriptor;
                            local_138._0_8_ = (Command *)*plVar11;
                          }
                          local_138._8_8_ = plVar11[1];
                          *plVar11 = (long)pCVar10;
                          plVar11[1] = 0;
                          *(undefined1 *)(plVar11 + 2) = 0;
                          message_05.Length = local_138._0_8_;
                          message_05.Data = (pNVar6->SourceRange).End.Ptr;
                          error(this,(Node *)(pNVar6->SourceRange).Start.Ptr,message_05);
                          pSVar15 = (ScalarNode *)local_138._16_8_;
                          pCVar10 = (Command *)local_138._0_8_;
                          if ((Command *)local_138._0_8_ != (Command *)(local_138 + 0x10)) {
LAB_00139272:
                            operator_delete(pCVar10,(ulong)((long)&(pSVar15->super_Node)._vptr_Node
                                                           + 1));
                          }
                        }
                        if ((SequenceNode *)local_f8._0_8_ != (SequenceNode *)(local_f8 + 0x10)) {
                          operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
                        }
                        llvm::yaml::
                        basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                        ::operator++(&local_68);
                      }
                      local_138._24_8_ = (pBVar8->mainFilename).field_2._M_allocated_capacity;
                      local_138._0_8_ = this->delegate;
                      local_138._8_8_ = (this->mainFilename)._M_dataplus._M_p;
                      local_138._16_8_ = (this->mainFilename)._M_string_length;
                      local_118._M_p._0_4_ =
                           *(int *)((long)&(pBVar8->mainFilename).field_2 + 8) -
                           (int)local_138._24_8_;
                      local_f8._0_8_ = (SequenceNode *)0x0;
                      local_f8._8_8_ = (pointer)0x0;
                      local_f8._16_8_ = 0;
                      std::
                      vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                      ::
                      _M_range_initialize<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>>
                                ((vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                                  *)local_f8,
                                 local_58.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                                 local_58.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
                      iVar5 = (*(pCVar10->super_JobDescriptor)._vptr_JobDescriptor[0xc])
                                        (pCVar10,local_138,_Var3._M_p,pcVar13,local_f8._0_8_,
                                         (long)(local_f8._8_8_ - local_f8._0_8_) >> 5);
                      cVar4 = (char)iVar5;
                      if ((SequenceNode *)local_f8._0_8_ != (SequenceNode *)0x0) {
                        operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
                      }
                      std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::~vector(&local_58);
                      goto LAB_00139642;
                    }
                    message_09.Length = (size_t)"invalid value type for command in \'commands\' map"
                    ;
                    message_09.Data = (C_00->super_Node).SourceRange.End.Ptr;
                    pcVar13 = "invalid value type for command in \'commands\' map";
                    error(this,(Node *)(C_00->super_Node).SourceRange.Start.Ptr,message_09);
                    iVar5 = 10;
LAB_0013965b:
                    bVar16 = false;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                    operator_delete(local_d8._M_dataplus._M_p,
                                    local_d8.field_2._M_allocated_capacity + 1);
                  }
                  if (((bVar16) || (iVar5 == 10)) || (iVar5 == 0)) goto LAB_00138c71;
                }
LAB_001397f6:
                if (local_140 != (Command *)0x0) {
                  (*(local_140->super_JobDescriptor)._vptr_JobDescriptor[1])();
                }
              }
            }
            else {
              if ((local_148.Base == (MappingNode *)0x0) ||
                 ((local_148.Base)->CurrentEntry == (KeyValueNode *)0x0)) goto LAB_0013986d;
              pNVar6 = llvm::yaml::KeyValueNode::getValue((local_148.Base)->CurrentEntry);
              message_11.Length =
                   (size_t)"invalid \'tool\' value type for command in \'commands\' map";
              message_11.Data = (pNVar6->SourceRange).End.Ptr;
              pcVar13 = "invalid \'tool\' value type for command in \'commands\' map";
              error(this,(Node *)(pNVar6->SourceRange).Start.Ptr,message_11);
              iVar5 = 3;
              while (local_148.Base != (MappingNode *)0x0) {
                llvm::yaml::
                basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                operator++(&local_148);
              }
            }
          }
          else {
            if ((local_148.Base == (MappingNode *)0x0) ||
               ((local_148.Base)->CurrentEntry == (KeyValueNode *)0x0)) goto LAB_0013986d;
            pNVar6 = llvm::yaml::KeyValueNode::getKey((local_148.Base)->CurrentEntry);
            message_10.Length =
                 (size_t)"expected \'tool\' initial key for command in \'commands\' map";
            message_10.Data = (pNVar6->SourceRange).End.Ptr;
            pcVar13 = "expected \'tool\' initial key for command in \'commands\' map";
            error(this,(Node *)(pNVar6->SourceRange).Start.Ptr,message_10);
            iVar5 = 3;
            while (local_148.Base != (MappingNode *)0x0) {
              llvm::yaml::
              basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
              operator++(&local_148);
            }
          }
        }
        else {
          pNVar7 = llvm::yaml::KeyValueNode::getKey(pKVar2);
          pNVar6 = (Node *)(pNVar7->SourceRange).Start.Ptr;
          pcVar14 = (pNVar7->SourceRange).End.Ptr;
          pcVar13 = "duplicate command in \'commands\' map";
LAB_00138b18:
          message_00.Length = (size_t)pcVar13;
          message_00.Data = pcVar14;
          error(this,pNVar6,message_00);
          iVar5 = 3;
        }
LAB_00138b22:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_allocated_capacity != &local_80) {
          operator_delete((void *)local_90._M_allocated_capacity,local_80._M_allocated_capacity + 1)
          ;
        }
        if ((iVar5 != 3) && (iVar5 != 0)) goto LAB_0013981b;
      }
      else {
        pNVar7 = llvm::yaml::KeyValueNode::getKey(pKVar2);
        pNVar6 = (Node *)(pNVar7->SourceRange).Start.Ptr;
        pcVar14 = (pNVar7->SourceRange).End.Ptr;
        pcVar13 = "invalid key type in \'commands\' map";
LAB_00138aaf:
        message.Length = (size_t)pcVar13;
        message.Data = pcVar14;
        error(this,pNVar6,message);
      }
      llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
      operator++(&local_60);
    } while (local_60.Base != (MappingNode *)0x0);
    iVar5 = 2;
LAB_0013981b:
    bVar16 = iVar5 == 2;
  }
  return bVar16;
LAB_0013984e:
  pcVar13 = 
  "ValueT &llvm::yaml::basic_collection_iterator<llvm::yaml::SequenceNode, llvm::yaml::Node>::operator*() const [BaseT = llvm::yaml::SequenceNode, ValueT = llvm::yaml::Node]"
  ;
  goto LAB_00139863;
}

Assistant:

bool parseCommandsMapping(llvm::yaml::MappingNode* map) {
    for (auto& entry: *map) {
      // Every key must be scalar.
      if (entry.getKey()->getType() != llvm::yaml::Node::NK_Scalar) {
        error(entry.getKey(), "invalid key type in 'commands' map");
        continue;
      }
      // Every value must be a mapping.
      if (entry.getValue()->getType() != llvm::yaml::Node::NK_Mapping) {
        error(entry.getValue(), "invalid value type in 'commands' map");
        continue;
      }

      std::string name = stringFromScalarNode(
          static_cast<llvm::yaml::ScalarNode*>(entry.getKey()));
      llvm::yaml::MappingNode* attrs = static_cast<llvm::yaml::MappingNode*>(
          entry.getValue());

      // Check that the command is not a duplicate.
      if (commands.count(name) != 0) {
        error(entry.getKey(), "duplicate command in 'commands' map");
        continue;
      }
      
      // Get the initial attribute, which must be the tool name.
      auto it = attrs->begin();
      if (it == attrs->end()) {
        error(entry.getKey(),
              "missing 'tool' key for command in 'command' map");
        continue;
      }
      if (!nodeIsScalarString(it->getKey(), "tool")) {
        error(it->getKey(),
              "expected 'tool' initial key for command in 'commands' map");
        // Skip to the end.
        while (it != attrs->end()) ++it;
        continue;
      }
      if (it->getValue()->getType() != llvm::yaml::Node::NK_Scalar) {
        error(it->getValue(),
              "invalid 'tool' value type for command in 'commands' map");
        // Skip to the end.
        while (it != attrs->end()) ++it;
        continue;
      }
      
      // Lookup the tool for this command.
      auto tool = getOrCreateTool(
          stringFromScalarNode(
              static_cast<llvm::yaml::ScalarNode*>(
                  it->getValue())),
          it->getValue());
      if (!tool) {
        return false;
      }
        
      // Create the command.
      auto command = tool->createCommand(name);
      if (!command) {
        error(it->getValue(), "tool failed to create a command");
        return false;
      }

      // Parse the remaining command attributes.
      ++it;
      for (; it != attrs->end(); ++it) {
        auto key = it->getKey();
        auto value = it->getValue();
        
        // If this is a known key, parse it.
        if (nodeIsScalarString(key, "inputs")) {
          if (value->getType() != llvm::yaml::Node::NK_Sequence) {
            error(value, "invalid value type for 'inputs' command key");
            continue;
          }

          llvm::yaml::SequenceNode* nodeNames =
            static_cast<llvm::yaml::SequenceNode*>(value);

          std::vector<Node*> nodes;
          for (auto& nodeName: *nodeNames) {
            if (nodeName.getType() != llvm::yaml::Node::NK_Scalar) {
              error(&nodeName, "invalid node type in 'inputs' command key");
              continue;
            }

            nodes.push_back(
                getOrCreateNode(
                    stringFromScalarNode(
                        static_cast<llvm::yaml::ScalarNode*>(&nodeName)),
                    /*isImplicit=*/true));
          }

          command->configureInputs(getContext(key), nodes);
        } else if (nodeIsScalarString(key, "outputs")) {
          if (value->getType() != llvm::yaml::Node::NK_Sequence) {
            error(value, "invalid value type for 'outputs' command key");
            continue;
          }

          llvm::yaml::SequenceNode* nodeNames =
            static_cast<llvm::yaml::SequenceNode*>(value);

          std::vector<Node*> nodes;
          for (auto& nodeName: *nodeNames) {
            if (nodeName.getType() != llvm::yaml::Node::NK_Scalar) {
              error(&nodeName, "invalid node type in 'outputs' command key");
              continue;
            }

            auto node = getOrCreateNode(
                    stringFromScalarNode(
                        static_cast<llvm::yaml::ScalarNode*>(&nodeName)),
                    /*isImplicit=*/true);
            nodes.push_back(node);

            // Add this command to the node producer list.
            node->getProducers().push_back(command.get());
          }

          command->configureOutputs(getContext(key), nodes);
        } else if (nodeIsScalarString(key, "description")) {
          if (value->getType() != llvm::yaml::Node::NK_Scalar) {
            error(value, "invalid value type for 'description' command key");
            continue;
          }

          command->configureDescription(
              getContext(key), stringFromScalarNode(
                  static_cast<llvm::yaml::ScalarNode*>(value)));
        } else {
          // Otherwise, it should be an attribute assignment.
          
          // All keys must be scalar.
          if (key->getType() != llvm::yaml::Node::NK_Scalar) {
            error(key, "invalid key type in 'commands' map");
            continue;
          }

          auto attribute = stringFromScalarNode(
              static_cast<llvm::yaml::ScalarNode*>(key));

          if (value->getType() == llvm::yaml::Node::NK_Mapping) {
            std::vector<std::pair<std::string, std::string>> values;
            for (auto& entry: *static_cast<llvm::yaml::MappingNode*>(value)) {
              // Every key must be scalar.
              if (entry.getKey()->getType() != llvm::yaml::Node::NK_Scalar) {
                error(entry.getKey(), ("invalid key type for '" + attribute +
                                       "' in 'commands' map"));
                continue;
              }
              // Every value must be scalar.
              if (entry.getValue()->getType() != llvm::yaml::Node::NK_Scalar) {
                error(entry.getKey(), ("invalid value type for '" + attribute +
                                       "' in 'commands' map"));
                continue;
              }

              std::string key = stringFromScalarNode(
                  static_cast<llvm::yaml::ScalarNode*>(entry.getKey()));
              std::string value = stringFromScalarNode(
                  static_cast<llvm::yaml::ScalarNode*>(entry.getValue()));
              values.push_back(std::make_pair(key, value));
            }

            if (!command->configureAttribute(
                    getContext(key), attribute,
                    std::vector<std::pair<StringRef, StringRef>>(
                        values.begin(), values.end()))) {
              return false;
            }
          } else if (value->getType() == llvm::yaml::Node::NK_Sequence) {
            std::vector<std::string> values;
            for (auto& node: *static_cast<llvm::yaml::SequenceNode*>(value)) {
              if (node.getType() != llvm::yaml::Node::NK_Scalar) {
                error(&node, "invalid value type for command in 'commands' map");
                continue;
              }
              values.push_back(
                  stringFromScalarNode(
                      static_cast<llvm::yaml::ScalarNode*>(&node)));
            }

            if (!command->configureAttribute(
                    getContext(key), attribute,
                    std::vector<StringRef>(values.begin(), values.end()))) {
              return false;
            }
          } else {
            if (value->getType() != llvm::yaml::Node::NK_Scalar) {
              error(value, "invalid value type for command in 'commands' map");
              continue;
            }
            
            if (!command->configureAttribute(
                    getContext(key), attribute,
                    stringFromScalarNode(
                        static_cast<llvm::yaml::ScalarNode*>(value)))) {
              return false;
            }
          }
        }
      }

      // Let the delegate know we loaded a command.
      delegate.loadedCommand(name, *command);

      // Add the command to the commands map.
      commands[name] = std::move(command);
    }

    return true;
  }